

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O2

AActor * RoughBlockCheck(AActor *mo,int index,void *param)

{
  FBlockNode *pFVar1;
  bool bVar2;
  int iVar3;
  AActor *target;
  FBlockNode **ppFVar4;
  
  ppFVar4 = blocklinks + index;
  do {
    pFVar1 = *ppFVar4;
    if (pFVar1 == (FBlockNode *)0x0) {
      return (AActor *)0x0;
    }
    target = pFVar1->Me;
    if (target != mo) {
      if (*param == '\x01') {
        bVar2 = AActor::CanSeek(mo,target);
        if (!bVar2) goto LAB_004233c0;
        target = pFVar1->Me;
      }
      if (*(char *)((long)param + 1) == '\x01') {
        iVar3 = P_PointOnDivlineSide
                          ((target->__Pos).X,(target->__Pos).Y,(divline_t *)((long)param + 8));
        if (iVar3 != 0) goto LAB_004233c0;
        target = pFVar1->Me;
      }
      bVar2 = AActor::IsOkayToAttack(mo,target);
      if (bVar2) {
        return pFVar1->Me;
      }
    }
LAB_004233c0:
    ppFVar4 = &pFVar1->NextActor;
  } while( true );
}

Assistant:

static AActor *RoughBlockCheck (AActor *mo, int index, void *param)
{
	BlockCheckInfo *info = (BlockCheckInfo *)param;

	FBlockNode *link;

	for (link = blocklinks[index]; link != NULL; link = link->NextActor)
	{
		if (link->Me != mo)
		{
			if (info->onlyseekable && !mo->CanSeek(link->Me))
			{
				continue;
			}
			if (info->frontonly && P_PointOnDivlineSide(link->Me->X(), link->Me->Y(), &info->frontline) != 0)
			{
				continue;
			}
			if (mo->IsOkayToAttack (link->Me))
			{
				return link->Me;
			}
		}
	}
	return NULL;
}